

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SliceStaticLayerParams::SerializeWithCachedSizes
          (SliceStaticLayerParams *this,CodedOutputStream *output)

{
  Rep *pRVar1;
  uint64 uVar2;
  int iVar3;
  bool *pbVar4;
  int iVar5;
  
  iVar5 = (this->beginids_).current_size_;
  if (0 < iVar5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_beginids_cached_byte_size_)
    ;
    iVar5 = (this->beginids_).current_size_;
  }
  iVar3 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
    iVar3 = 0;
  }
  for (; iVar5 != iVar3; iVar3 = iVar3 + 1) {
    uVar2 = beginids(this,iVar3);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,uVar2);
  }
  if (0 < (this->beginmasks_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x12);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_beginmasks_cached_byte_size_);
    pRVar1 = (this->beginmasks_).rep_;
    pbVar4 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      pbVar4 = (bool *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteBoolArray
              (pbVar4,(this->beginmasks_).current_size_,output);
  }
  iVar5 = (this->endids_).current_size_;
  if (0 < iVar5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x1a);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_endids_cached_byte_size_);
    iVar5 = (this->endids_).current_size_;
  }
  iVar3 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; iVar5 != iVar3; iVar3 = iVar3 + 1) {
    uVar2 = endids(this,iVar3);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,uVar2);
  }
  if (0 < (this->endmasks_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x22);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_endmasks_cached_byte_size_)
    ;
    pRVar1 = (this->endmasks_).rep_;
    pbVar4 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      pbVar4 = (bool *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteBoolArray
              (pbVar4,(this->endmasks_).current_size_,output);
  }
  iVar5 = (this->strides_).current_size_;
  if (0 < iVar5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x2a);
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,this->_strides_cached_byte_size_);
    iVar5 = (this->strides_).current_size_;
  }
  iVar3 = 0;
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  for (; iVar5 != iVar3; iVar3 = iVar3 + 1) {
    uVar2 = strides(this,iVar3);
    google::protobuf::io::CodedOutputStream::WriteVarint64(output,uVar2);
  }
  if (0 < (this->squeezemasks_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x32);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_squeezemasks_cached_byte_size_);
    pRVar1 = (this->squeezemasks_).rep_;
    pbVar4 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      pbVar4 = (bool *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteBoolArray
              (pbVar4,(this->squeezemasks_).current_size_,output);
    return;
  }
  return;
}

Assistant:

void SliceStaticLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SliceStaticLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 beginIds = 1;
  if (this->beginids_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_beginids_cached_byte_size_);
  }
  for (int i = 0, n = this->beginids_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->beginids(i), output);
  }

  // repeated bool beginMasks = 2;
  if (this->beginmasks_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_beginmasks_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->beginmasks().data(), this->beginmasks_size(), output);
  }

  // repeated int64 endIds = 3;
  if (this->endids_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(3, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_endids_cached_byte_size_);
  }
  for (int i = 0, n = this->endids_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->endids(i), output);
  }

  // repeated bool endMasks = 4;
  if (this->endmasks_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(4, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_endmasks_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->endmasks().data(), this->endmasks_size(), output);
  }

  // repeated int64 strides = 5;
  if (this->strides_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(5, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_strides_cached_byte_size_);
  }
  for (int i = 0, n = this->strides_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->strides(i), output);
  }

  // repeated bool squeezeMasks = 6;
  if (this->squeezemasks_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(6, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_squeezemasks_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->squeezemasks().data(), this->squeezemasks_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SliceStaticLayerParams)
}